

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O2

Aig_Tru_t ** Aig_RManTableLookup(Aig_RMan_t *p,uint *pTruth,int nVars)

{
  Aig_Tru_t *pAVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  Aig_Tru_t *pAVar7;
  
  bVar2 = (char)nVars - 5U & 0x1f;
  uVar5 = 0;
  uVar6 = (ulong)(uint)(1 << bVar2);
  if (1 << bVar2 < 1) {
    uVar6 = uVar5;
  }
  if (nVars < 6) {
    uVar6 = 1;
  }
  uVar3 = 0;
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    uVar3 = uVar3 ^ Aig_RManTableLookup::s_Primes[(uint)uVar5 & 0xf] * pTruth[uVar5];
  }
  pAVar1 = (Aig_Tru_t *)(p->pBins + (int)(uVar3 % (uint)p->nBins));
  do {
    pAVar7 = pAVar1;
    pAVar1 = pAVar7->pNext;
    if (pAVar1 == (Aig_Tru_t *)0x0) {
      return &pAVar7->pNext;
    }
    iVar4 = Kit_TruthIsEqual((uint *)(pAVar1 + 1),pTruth,nVars);
  } while (iVar4 == 0);
  return &pAVar7->pNext;
}

Assistant:

Aig_Tru_t ** Aig_RManTableLookup( Aig_RMan_t * p, unsigned * pTruth, int nVars )
{
    static int s_Primes[16] = { 
        1291, 1699, 1999, 2357, 2953, 3313, 3907, 4177, 
        4831, 5147, 5647, 6343, 6899, 7103, 7873, 8147 };
    Aig_Tru_t ** ppSpot, * pEntry;
    ppSpot = p->pBins + Aig_RManTableHash( pTruth, nVars, p->nBins, s_Primes );
    for ( pEntry = *ppSpot; pEntry; ppSpot = &pEntry->pNext, pEntry = pEntry->pNext )
        if ( Kit_TruthIsEqual( pEntry->pTruth, pTruth, nVars ) )
            return ppSpot;
    return ppSpot;
}